

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdecode.c
# Opt level: O3

_Bool rcnb_decode_short(wchar_t *value_in,char **value_out)

{
  wchar_t wVar1;
  char *pcVar2;
  bool bVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  
  wVar1 = *value_in;
  uVar8 = 0xffffffff;
  uVar11 = 0;
  do {
    if (*(wchar_t *)((long)L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ" + uVar11) == wVar1) {
      if ((uVar11 >> 0x21 & 1) == 0) {
        lVar9 = 0x3c;
        lVar7 = 0;
        goto LAB_001017d6;
      }
      break;
    }
    uVar11 = uVar11 + 4;
  } while (uVar11 != 0x3c);
  lVar9 = 0x3c;
  lVar7 = 0;
  do {
    if (L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[lVar7] == value_in[2]) goto LAB_0010188c;
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + -4;
  } while (lVar9 != 0);
  lVar7 = 0xffffffff;
LAB_0010188c:
  uVar5 = (uint)lVar7;
  lVar9 = 0x3c;
  lVar7 = 0;
  do {
    if (L"cCĆćĈĉĊċČčƇƈÇȻȼ"[lVar7] == value_in[3]) {
      uVar8 = (uint)lVar7;
      break;
    }
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + -4;
  } while (lVar9 != 0);
  uVar6 = 0xffffffff;
  lVar7 = 0x3c;
  lVar9 = 0;
  do {
    if (L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[lVar9] == wVar1) goto LAB_00101908;
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + -4;
  } while (lVar7 != 0);
  lVar9 = 0xffffffff;
LAB_00101908:
  uVar10 = (uint)lVar9;
  bVar3 = true;
  lVar9 = 0x28;
  lVar7 = 0;
  do {
    if (L"bBƀƁƃƄƅßÞþ"[lVar7] == value_in[1]) goto LAB_00101989;
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + -4;
  } while (lVar9 != 0);
LAB_0010198c:
  if (((int)(uVar5 | uVar8 | uVar10 | uVar6) < 0) ||
     (uVar6 = ((uVar5 * 0xf + uVar8) * 0xf + uVar10) * 10 + uVar6, 0x7fff < uVar6)) {
    _Var4 = false;
  }
  else {
    uVar8 = uVar6 | 0x8000;
    if (!bVar3) {
      uVar8 = uVar6;
    }
    pcVar2 = *value_out;
    *value_out = pcVar2 + 1;
    *pcVar2 = (char)(uVar8 >> 8);
    pcVar2 = *value_out;
    *value_out = pcVar2 + 1;
    *pcVar2 = (char)uVar8;
    _Var4 = true;
  }
  return _Var4;
  while( true ) {
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + -4;
    if (lVar9 == 0) break;
LAB_001017d6:
    if (L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[lVar7] == wVar1) goto LAB_001017ea;
  }
  lVar7 = 0xffffffff;
LAB_001017ea:
  uVar5 = (uint)lVar7;
  uVar10 = 0xffffffff;
  lVar9 = 0x3c;
  lVar7 = 0;
  do {
    if (L"cCĆćĈĉĊċČčƇƈÇȻȼ"[lVar7] == value_in[1]) goto LAB_0010182d;
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + -4;
  } while (lVar9 != 0);
  lVar7 = 0xffffffff;
LAB_0010182d:
  uVar8 = (uint)lVar7;
  lVar7 = 0x3c;
  lVar9 = 0;
  do {
    if (L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[lVar9] == value_in[2]) {
      uVar10 = (uint)lVar9;
      break;
    }
    lVar9 = lVar9 + 1;
    lVar7 = lVar7 + -4;
  } while (lVar7 != 0);
  uVar6 = 0xffffffff;
  lVar9 = 0x28;
  lVar7 = 0;
  do {
    if (L"bBƀƁƃƄƅßÞþ"[lVar7] == value_in[3]) {
      bVar3 = false;
      goto LAB_00101989;
    }
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + -4;
  } while (lVar9 != 0);
  bVar3 = false;
  goto LAB_0010198c;
LAB_00101989:
  uVar6 = (uint)lVar7;
  goto LAB_0010198c;
}

Assistant:

bool rcnb_decode_short(const wchar_t* value_in, char** value_out)
{
    bool reverse = find(cr, sr, *value_in) < 0;
    int idx[4];
    if (!reverse) {
        idx[0] = find(cr, sr, *value_in);
        idx[1] = find(cc, sc, *(value_in + 1));
        idx[2] = find(cn, sn, *(value_in + 2));
        idx[3] = find(cb, sb, *(value_in + 3));
    } else {
        idx[0] = find(cr, sr, *(value_in + 2));
        idx[1] = find(cc, sc, *(value_in + 3));
        idx[2] = find(cn, sn, *value_in);
        idx[3] = find(cb, sb, *(value_in + 1));
    }
    if (idx[0] < 0 || idx[1] < 0 || idx[2] < 0 || idx[3] < 0)
        return false;
    int result = idx[0] * scnb + idx[1] * snb + idx[2] * sb + idx[3];
    if (result > 0x7FFF)
        return false;
    result = reverse ? result | 0x8000 : result;
    *(*value_out)++ = (char)(result >> 8);
    *(*value_out)++ = (char)(result & 0xFF);
    return true;
}